

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void Am_Connection::Delete_Connection(Am_Connection *doomed_connection_ptr)

{
  connection_list_class **ppcVar1;
  Am_Connection *this;
  Connection_List_Ptr pcVar2;
  bool bVar3;
  Connection_List_Ptr local_20;
  Connection_List_Ptr old_place_holder;
  Connection_List_Ptr place_holder;
  Am_Connection *doomed_connection_ptr_local;
  
  pcVar2 = connection_list;
  old_place_holder = connection_list;
  local_20 = connection_list;
  if (connection_list != (Connection_List_Ptr)0x0) {
    if (connection_list->connection_ptr == doomed_connection_ptr) {
      ppcVar1 = &connection_list->next;
      bVar3 = connection_list != (Connection_List_Ptr)0x0;
      connection_list = *ppcVar1;
      if (bVar3) {
        operator_delete(pcVar2);
      }
    }
    else {
      while( true ) {
        bVar3 = false;
        if (old_place_holder != (Connection_List_Ptr)0x0) {
          bVar3 = old_place_holder->connection_ptr != doomed_connection_ptr;
        }
        if (!bVar3) break;
        local_20 = old_place_holder;
        old_place_holder = old_place_holder->next;
      }
      if (old_place_holder != (Connection_List_Ptr)0x0) {
        local_20->next = old_place_holder->next;
        this = old_place_holder->connection_ptr;
        if (this != (Am_Connection *)0x0) {
          ~Am_Connection(this);
          operator_delete(this);
        }
        if (old_place_holder != (Connection_List_Ptr)0x0) {
          operator_delete(old_place_holder);
        }
        num_sockets = num_sockets + -1;
      }
    }
  }
  return;
}

Assistant:

void
Am_Connection::Delete_Connection(Am_Connection *doomed_connection_ptr)
{
  Connection_List_Ptr place_holder, old_place_holder;
  old_place_holder = place_holder = connection_list;
  if (place_holder == nullptr) {
  } else {
    if (place_holder->connection_ptr == doomed_connection_ptr) {
      connection_list = place_holder->next;
      delete (place_holder);
    } else {
      while ((place_holder != nullptr) &&
             (place_holder->connection_ptr != doomed_connection_ptr)) {
        old_place_holder = place_holder;
        place_holder = place_holder->next;
      }
      if (place_holder != nullptr) {
        old_place_holder->next = place_holder->next;
        delete (place_holder->connection_ptr);
        delete (place_holder);
        num_sockets--;
      } else {
      }
    }
  }
}